

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void TestEmbedType<EMBED_X509,x509_st,x509_st,stack_st_X509>
               (Span<const_unsigned_char> inp,_func_int_x509_st_ptr_uint8_t_ptr_ptr *i2d,
               _func_EMBED_X509_ptr *embed_new,_func_void_EMBED_X509_ptr *embed_free,
               _func_EMBED_X509_ptr_EMBED_X509_ptr_ptr_uint8_t_ptr_ptr_long *d2i_embed,
               _func_int_EMBED_X509_ptr_uint8_t_ptr_ptr *i2d_embed,
               _func_size_t_stack_st_X509_ptr *sk_num,
               _func_x509_st_ptr_stack_st_X509_ptr_size_t *sk_value)

{
  unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *puVar1;
  Span<const_unsigned_char> expected;
  Span<const_unsigned_char> expected_00;
  Span<const_unsigned_char> expected_01;
  Span<const_unsigned_char> expected_02;
  Span<const_unsigned_char> expected_03;
  bool bVar2;
  cbb_st *pcVar3;
  char *pcVar4;
  uchar *puVar5;
  size_t sVar6;
  EMBED_X509 *pEVar7;
  pointer pEVar8;
  uint8_t *puVar9;
  x509_st *pxVar10;
  _func_EMBED_X509_ptr_EMBED_X509_ptr_ptr_uint8_t_ptr_ptr_long *expected_predicate_value;
  Span<const_unsigned_char> local_6d8;
  _func_int_x509_st_ptr_uint8_t_ptr_ptr *local_6c8;
  uchar *puStack_6c0;
  _func_int_x509_st_ptr_uint8_t_ptr_ptr *local_6b8;
  uchar *puStack_6b0;
  AssertHelper local_6a8;
  Message local_6a0;
  uint local_694;
  size_t local_690;
  undefined1 local_688 [8];
  AssertionResult gtest_ar;
  string local_668;
  AssertHelper local_648;
  Message local_640;
  undefined1 local_638 [8];
  AssertionResult gtest_ar__18;
  string local_610;
  AssertHelper local_5f0;
  Message local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_5b0;
  Message local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_570;
  Message local_568;
  int local_55c;
  undefined1 local_558 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_528;
  Message local_520;
  int local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_4e0;
  Message local_4d8;
  int local_4cc;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_498;
  Message local_490;
  int local_484;
  undefined1 local_480 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_450;
  Message local_448;
  int local_43c;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_408;
  Message local_400;
  int local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__10;
  CBB child;
  AssertHelper local_390;
  Message local_388;
  int local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_348;
  Message local_340;
  int local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__8;
  CBB seq;
  AssertHelper local_2d0;
  Message local_2c8;
  int local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__7;
  string local_298;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__5;
  string local_1f0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  uint8_t *ptr;
  AssertHelper local_148;
  Message local_140;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_100;
  Message local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__1;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  undefined1 local_78 [8];
  ScopedCBB cbb;
  unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> obj;
  _func_EMBED_X509_ptr_EMBED_X509_ptr_ptr_uint8_t_ptr_ptr_long *d2i_embed_local;
  _func_void_EMBED_X509_ptr *embed_free_local;
  _func_EMBED_X509_ptr *embed_new_local;
  _func_int_x509_st_ptr_uint8_t_ptr_ptr *i2d_local;
  Span<const_unsigned_char> inp_local;
  
  inp_local.data_ = (uchar *)inp.size_;
  i2d_local = (_func_int_x509_st_ptr_uint8_t_ptr_ptr *)inp.data_;
  expected_predicate_value = d2i_embed;
  d2i_embed_local = (_func_EMBED_X509_ptr_EMBED_X509_ptr_ptr_uint8_t_ptr_ptr_long *)embed_free;
  embed_free_local = (_func_void_EMBED_X509_ptr *)embed_new;
  embed_new_local = (_func_EMBED_X509_ptr *)i2d;
  std::unique_ptr<EMBED_X509,void(*)(EMBED_X509*)>::unique_ptr<void(*)(EMBED_X509*),void>
            ((unique_ptr<EMBED_X509,void(*)(EMBED_X509*)> *)((long)&cbb.ctx_.u + 0x18),(pointer)0x0,
             (deleter_type *)&d2i_embed_local);
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
  local_9c = CBB_init(pcVar3,0x40);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_98,&local_9c,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)local_98,(AssertionResult *)"CBB_init(cbb.get(), 64)","false",
               "true",(char *)expected_predicate_value);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0xbbc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    testing::Message::~Message(&local_a8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
    puVar5 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&i2d_local);
    sVar6 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&i2d_local);
    local_ec = CBB_add_asn1_element(pcVar3,0x20000010,puVar5,sVar6);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_e8,&local_ec,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar2) {
      testing::Message::Message(&local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_e8,
                 (AssertionResult *)
                 "CBB_add_asn1_element(cbb.get(), (0x10u | (0x20u << 24)), inp.data(), inp.size())",
                 "false","true",(char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbbe,pcVar4);
      testing::internal::AssertHelper::operator=(&local_100,&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_f8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
      local_134 = CBB_flush(pcVar3);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_130,&local_134,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
      if (!bVar2) {
        testing::Message::Message(&local_140);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&ptr,(internal *)local_130,(AssertionResult *)"CBB_flush(cbb.get())",
                   "false","true",(char *)expected_predicate_value);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbbf,pcVar4);
        testing::internal::AssertHelper::operator=(&local_148,&local_140);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        std::__cxx11::string::~string((string *)&ptr);
        testing::Message::~Message(&local_140);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )CBB_data(pcVar3);
        pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
        sVar6 = CBB_len(pcVar3);
        pEVar7 = (*d2i_embed)((EMBED_X509 **)0x0,(uint8_t **)&gtest_ar__3.message_,sVar6);
        puVar1 = (unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)((long)&cbb.ctx_.u + 0x18);
        std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::reset(puVar1,pEVar7);
        testing::AssertionResult::AssertionResult<std::unique_ptr<EMBED_X509,void(*)(EMBED_X509*)>>
                  ((AssertionResult *)local_180,puVar1,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
        if (!bVar2) {
          testing::Message::Message(&local_188);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_180,
                     (AssertionResult *)0x8733ab,"false","true",(char *)expected_predicate_value);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xbc2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_190,&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_188);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::operator->
                             ((unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                              ((long)&cbb.ctx_.u + 0x18));
          testing::AssertionResult::AssertionResult<x509_st*>
                    ((AssertionResult *)local_1c0,&pEVar8->simple,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
          if (!bVar2) {
            testing::Message::Message(&local_1c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_1f0,(internal *)local_1c0,(AssertionResult *)"obj->simple","false",
                       "true",(char *)expected_predicate_value);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0xbc3,pcVar4);
            testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
            testing::internal::AssertHelper::~AssertHelper(&local_1d0);
            std::__cxx11::string::~string((string *)&local_1f0);
            testing::Message::~Message(&local_1c8);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::operator->
                               ((unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                ((long)&cbb.ctx_.u + 0x18));
            gtest_ar__5.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )i2d_local;
            expected_03.size_ = (size_t)inp_local.data_;
            expected_03.data_ = (uchar *)i2d_local;
            TestSerialize<x509_st*,x509_st*>
                      (pEVar8->simple,(_func_int_x509_st_ptr_uint8_t_ptr_ptr *)embed_new_local,
                       expected_03);
            pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::operator->
                               ((unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                ((long)&cbb.ctx_.u + 0x18));
            local_219 = pEVar8->opt == (X509 *)0x0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_218,&local_219,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
            if (!bVar2) {
              testing::Message::Message(&local_228);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_218,
                         (AssertionResult *)"obj->opt","true","false",
                         (char *)expected_predicate_value);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_230,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0xbc6,pcVar4);
              testing::internal::AssertHelper::operator=(&local_230,&local_228);
              testing::internal::AssertHelper::~AssertHelper(&local_230);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_228);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
            pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::operator->
                               ((unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                ((long)&cbb.ctx_.u + 0x18));
            local_261 = pEVar8->seq == (stack_st_X509 *)0x0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_260,&local_261,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
            if (!bVar2) {
              testing::Message::Message(&local_270);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_298,(internal *)local_260,(AssertionResult *)"obj->seq","true",
                         "false",(char *)expected_predicate_value);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_278,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0xbc7,pcVar4);
              testing::internal::AssertHelper::operator=(&local_278,&local_270);
              testing::internal::AssertHelper::~AssertHelper(&local_278);
              std::__cxx11::string::~string((string *)&local_298);
              testing::Message::~Message(&local_270);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
            pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::get
                               ((unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                ((long)&cbb.ctx_.u + 0x18));
            pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
            puVar9 = CBB_data(pcVar3);
            pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
            sVar6 = CBB_len(pcVar3);
            bssl::Span<const_unsigned_char>::Span
                      ((Span<const_unsigned_char> *)&gtest_ar__7.message_,puVar9,sVar6);
            TestSerialize<EMBED_X509*,EMBED_X509*>(pEVar8,i2d_embed,stack0xfffffffffffffd58);
            bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::Reset
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
            pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
            local_2bc = CBB_init(pcVar3,0x40);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_2b8,&local_2bc,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
            if (!bVar2) {
              testing::Message::Message(&local_2c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)((long)&seq.u + 0x18),(internal *)local_2b8,
                         (AssertionResult *)"CBB_init(cbb.get(), 64)","false","true",
                         (char *)expected_predicate_value);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2d0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0xbcd,pcVar4);
              testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
              testing::internal::AssertHelper::~AssertHelper(&local_2d0);
              std::__cxx11::string::~string((string *)((long)&seq.u + 0x18));
              testing::Message::~Message(&local_2c8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78)
              ;
              local_334 = CBB_add_asn1(pcVar3,(CBB *)&gtest_ar__8.message_,0x20000010);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_330,&local_334,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
              if (!bVar2) {
                testing::Message::Message(&local_340);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__9.message_,(internal *)local_330,
                           (AssertionResult *)
                           "CBB_add_asn1(cbb.get(), &seq, (0x10u | (0x20u << 24)))","false","true",
                           (char *)expected_predicate_value);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_348,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0xbcf,pcVar4);
                testing::internal::AssertHelper::operator=(&local_348,&local_340);
                testing::internal::AssertHelper::~AssertHelper(&local_348);
                std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                testing::Message::~Message(&local_340);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                puVar5 = bssl::Span<const_unsigned_char>::data
                                   ((Span<const_unsigned_char> *)&i2d_local);
                sVar6 = bssl::Span<const_unsigned_char>::size
                                  ((Span<const_unsigned_char> *)&i2d_local);
                local_37c = CBB_add_bytes((CBB *)&gtest_ar__8.message_,puVar5,sVar6);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_378,&local_37c,(type *)0x0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_378);
                if (!bVar2) {
                  testing::Message::Message(&local_388);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)((long)&child.u + 0x18),(internal *)local_378,
                             (AssertionResult *)"CBB_add_bytes(&seq, inp.data(), inp.size())",
                             "false","true",(char *)expected_predicate_value);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_390,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                             ,0xbd0,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_390,&local_388);
                  testing::internal::AssertHelper::~AssertHelper(&local_390);
                  std::__cxx11::string::~string((string *)((long)&child.u + 0x18));
                  testing::Message::~Message(&local_388);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_3f4 = CBB_add_asn1((CBB *)&gtest_ar__8.message_,
                                           (CBB *)&gtest_ar__10.message_,0xa0000000);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_3f0,&local_3f4,(type *)0x0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3f0);
                  if (!bVar2) {
                    testing::Message::Message(&local_400);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__11.message_,(internal *)local_3f0,
                               (AssertionResult *)
                               "CBB_add_asn1( &seq, &child, (0x80u << 24) | (0x20u << 24) | 0)",
                               "false","true",(char *)expected_predicate_value);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_408,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                               ,0xbd3,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_408,&local_400);
                    testing::internal::AssertHelper::~AssertHelper(&local_408);
                    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                    testing::Message::~Message(&local_400);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    puVar5 = bssl::Span<const_unsigned_char>::data
                                       ((Span<const_unsigned_char> *)&i2d_local);
                    sVar6 = bssl::Span<const_unsigned_char>::size
                                      ((Span<const_unsigned_char> *)&i2d_local);
                    local_43c = CBB_add_bytes((CBB *)&gtest_ar__10.message_,puVar5,sVar6);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_438,&local_43c,(type *)0x0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_438);
                    if (!bVar2) {
                      testing::Message::Message(&local_448);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__12.message_,(internal *)local_438,
                                 (AssertionResult *)"CBB_add_bytes(&child, inp.data(), inp.size())",
                                 "false","true",(char *)expected_predicate_value);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_450,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                 ,0xbd4,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_450,&local_448);
                      testing::internal::AssertHelper::~AssertHelper(&local_450);
                      std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                      testing::Message::~Message(&local_448);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_484 = CBB_add_asn1((CBB *)&gtest_ar__8.message_,
                                               (CBB *)&gtest_ar__10.message_,0xa0000001);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_480,&local_484,(type *)0x0);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_480);
                      if (!bVar2) {
                        testing::Message::Message(&local_490);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__13.message_,(internal *)local_480,
                                   (AssertionResult *)
                                   "CBB_add_asn1( &seq, &child, (0x80u << 24) | (0x20u << 24) | 1)",
                                   "false","true",(char *)expected_predicate_value);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_498,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                   ,0xbd6,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_498,&local_490);
                        testing::internal::AssertHelper::~AssertHelper(&local_498);
                        std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                        testing::Message::~Message(&local_490);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        puVar5 = bssl::Span<const_unsigned_char>::data
                                           ((Span<const_unsigned_char> *)&i2d_local);
                        sVar6 = bssl::Span<const_unsigned_char>::size
                                          ((Span<const_unsigned_char> *)&i2d_local);
                        local_4cc = CBB_add_bytes((CBB *)&gtest_ar__10.message_,puVar5,sVar6);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_4c8,&local_4cc,(type *)0x0);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_4c8);
                        if (!bVar2) {
                          testing::Message::Message(&local_4d8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__14.message_,(internal *)local_4c8,
                                     (AssertionResult *)
                                     "CBB_add_bytes(&child, inp.data(), inp.size())","false","true",
                                     (char *)expected_predicate_value);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_4e0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                     ,0xbd7,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
                          testing::internal::AssertHelper::~AssertHelper(&local_4e0);
                          std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                          testing::Message::~Message(&local_4d8);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar2;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          puVar5 = bssl::Span<const_unsigned_char>::data
                                             ((Span<const_unsigned_char> *)&i2d_local);
                          sVar6 = bssl::Span<const_unsigned_char>::size
                                            ((Span<const_unsigned_char> *)&i2d_local);
                          local_514 = CBB_add_bytes((CBB *)&gtest_ar__10.message_,puVar5,sVar6);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_510,&local_514,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_510);
                          if (!bVar2) {
                            testing::Message::Message(&local_520);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__15.message_,(internal *)local_510,
                                       (AssertionResult *)
                                       "CBB_add_bytes(&child, inp.data(), inp.size())","false",
                                       "true",(char *)expected_predicate_value);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_528,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                       ,0xbd8,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_528,&local_520);
                            testing::internal::AssertHelper::~AssertHelper(&local_528);
                            std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                            testing::Message::~Message(&local_520);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            pcVar3 = bssl::internal::
                                     StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>
                                                 *)local_78);
                            local_55c = CBB_flush(pcVar3);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_558,&local_55c,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_558);
                            if (!bVar2) {
                              testing::Message::Message(&local_568);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__16.message_,(internal *)local_558,
                                         (AssertionResult *)"CBB_flush(cbb.get())","false","true",
                                         (char *)expected_predicate_value);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_570,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                         ,0xbd9,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_570,&local_568);
                              testing::internal::AssertHelper::~AssertHelper(&local_570);
                              std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                              testing::Message::~Message(&local_568);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar2;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_558)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              pcVar3 = bssl::internal::
                                       StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                                 ((
                                                  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>
                                                  *)local_78);
                              gtest_ar__3.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl =
                                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                    )CBB_data(pcVar3);
                              pcVar3 = bssl::internal::
                                       StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                                 ((
                                                  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>
                                                  *)local_78);
                              sVar6 = CBB_len(pcVar3);
                              pEVar7 = (*d2i_embed)((EMBED_X509 **)0x0,
                                                    (uint8_t **)&gtest_ar__3.message_,sVar6);
                              puVar1 = (unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                       ((long)&cbb.ctx_.u + 0x18);
                              std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::reset
                                        (puVar1,pEVar7);
                              testing::AssertionResult::
                              AssertionResult<std::unique_ptr<EMBED_X509,void(*)(EMBED_X509*)>>
                                        ((AssertionResult *)local_5a0,puVar1,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_5a0);
                              if (!bVar2) {
                                testing::Message::Message(&local_5a8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__17.message_,(internal *)local_5a0,
                                           (AssertionResult *)0x8733ab,"false","true",
                                           (char *)expected_predicate_value);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_5b0,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                           ,0xbdc,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_5b0,&local_5a8);
                                testing::internal::AssertHelper::~AssertHelper(&local_5b0);
                                std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                                testing::Message::~Message(&local_5a8);
                              }
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar2;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_5a0);
                              if (gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::
                                         operator->((unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>
                                                     *)((long)&cbb.ctx_.u + 0x18));
                                testing::AssertionResult::AssertionResult<x509_st*>
                                          ((AssertionResult *)local_5e0,&pEVar8->simple,(type *)0x0)
                                ;
                                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_5e0);
                                if (!bVar2) {
                                  testing::Message::Message(&local_5e8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            (&local_610,(internal *)local_5e0,
                                             (AssertionResult *)"obj->simple","false","true",
                                             (char *)expected_predicate_value);
                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_5f0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                             ,0xbdd,pcVar4);
                                  testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_5f0);
                                  std::__cxx11::string::~string((string *)&local_610);
                                  testing::Message::~Message(&local_5e8);
                                }
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar2;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_5e0);
                                if (gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::
                                           operator->((
                                                  unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                                  ((long)&cbb.ctx_.u + 0x18));
                                  gtest_ar__18.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl =
                                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )i2d_local;
                                  expected_02.size_ = (size_t)inp_local.data_;
                                  expected_02.data_ = (uchar *)i2d_local;
                                  TestSerialize<x509_st*,x509_st*>
                                            (pEVar8->simple,
                                             (_func_int_x509_st_ptr_uint8_t_ptr_ptr *)
                                             embed_new_local,expected_02);
                                  pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::
                                           operator->((
                                                  unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                                  ((long)&cbb.ctx_.u + 0x18));
                                  testing::AssertionResult::AssertionResult<x509_st*>
                                            ((AssertionResult *)local_638,&pEVar8->opt,(type *)0x0);
                                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_638);
                                  if (!bVar2) {
                                    testing::Message::Message(&local_640);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              (&local_668,(internal *)local_638,
                                               (AssertionResult *)"obj->opt","false","true",
                                               (char *)expected_predicate_value);
                                    pcVar4 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_648,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                               ,0xbdf,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              (&local_648,&local_640);
                                    testing::internal::AssertHelper::~AssertHelper(&local_648);
                                    std::__cxx11::string::~string((string *)&local_668);
                                    testing::Message::~Message(&local_640);
                                  }
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar2;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_638);
                                  if (gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::
                                             operator->((
                                                  unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                                  ((long)&cbb.ctx_.u + 0x18));
                                    gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                            )i2d_local;
                                    expected_01.size_ = (size_t)inp_local.data_;
                                    expected_01.data_ = (uchar *)i2d_local;
                                    TestSerialize<x509_st*,x509_st*>
                                              (pEVar8->opt,
                                               (_func_int_x509_st_ptr_uint8_t_ptr_ptr *)
                                               embed_new_local,expected_01);
                                    pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::
                                             operator->((
                                                  unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                                  ((long)&cbb.ctx_.u + 0x18));
                                    local_690 = (*sk_num)(pEVar8->seq);
                                    local_694 = 2;
                                    testing::internal::EqHelper::
                                    Compare<unsigned_long,_unsigned_int,_nullptr>
                                              ((EqHelper *)local_688,"sk_num(obj->seq)","2u",
                                               &local_690,&local_694);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_688);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_6a0);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_688);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_6a8,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                                                 ,0xbe1,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                (&local_6a8,&local_6a0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_6a8);
                                      testing::Message::~Message(&local_6a0);
                                    }
                                    gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar2;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_688);
                                    if (gtest_ar__1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::
                                               operator->((
                                                  unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                                  ((long)&cbb.ctx_.u + 0x18));
                                      pxVar10 = (*sk_value)(pEVar8->seq,0);
                                      local_6b8 = i2d_local;
                                      puStack_6b0 = inp_local.data_;
                                      expected_00.size_ = (size_t)inp_local.data_;
                                      expected_00.data_ = (uchar *)i2d_local;
                                      TestSerialize<x509_st*,x509_st*>
                                                (pxVar10,(_func_int_x509_st_ptr_uint8_t_ptr_ptr *)
                                                         embed_new_local,expected_00);
                                      pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::
                                               operator->((
                                                  unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)
                                                  ((long)&cbb.ctx_.u + 0x18));
                                      pxVar10 = (*sk_value)(pEVar8->seq,1);
                                      local_6c8 = i2d_local;
                                      puStack_6c0 = inp_local.data_;
                                      expected.size_ = (size_t)inp_local.data_;
                                      expected.data_ = (uchar *)i2d_local;
                                      TestSerialize<x509_st*,x509_st*>
                                                (pxVar10,(_func_int_x509_st_ptr_uint8_t_ptr_ptr *)
                                                         embed_new_local,expected);
                                      pEVar8 = std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::
                                               get((unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *
                                                   )((long)&cbb.ctx_.u + 0x18));
                                      pcVar3 = bssl::internal::
                                               StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>
                                               ::get((
                                                  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>
                                                  *)local_78);
                                      puVar9 = CBB_data(pcVar3);
                                      pcVar3 = bssl::internal::
                                               StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>
                                               ::get((
                                                  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>
                                                  *)local_78);
                                      sVar6 = CBB_len(pcVar3);
                                      bssl::Span<const_unsigned_char>::Span(&local_6d8,puVar9,sVar6)
                                      ;
                                      TestSerialize<EMBED_X509*,EMBED_X509*>
                                                (pEVar8,i2d_embed,local_6d8);
                                      gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ = 0;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_78);
  std::unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)>::~unique_ptr
            ((unique_ptr<EMBED_X509,_void_(*)(EMBED_X509_*)> *)((long)&cbb.ctx_.u + 0x18));
  return;
}

Assistant:

void TestEmbedType(bssl::Span<const uint8_t> inp,
                   int (*i2d)(MaybeConstT *, uint8_t **),
                   EmbedT *(*embed_new)(), void (*embed_free)(EmbedT *),
                   EmbedT *(*d2i_embed)(EmbedT **, const uint8_t **, long),
                   int (*i2d_embed)(EmbedT *, uint8_t **),
                   size_t (*sk_num)(const StackT *),
                   T *(*sk_value)(const StackT *, size_t)) {
  std::unique_ptr<EmbedT, decltype(embed_free)> obj(nullptr, embed_free);

  // Test only the first field present.
  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), 64));
  ASSERT_TRUE(CBB_add_asn1_element(cbb.get(), CBS_ASN1_SEQUENCE, inp.data(),
                                   inp.size()));
  ASSERT_TRUE(CBB_flush(cbb.get()));
  const uint8_t *ptr = CBB_data(cbb.get());
  obj.reset(d2i_embed(nullptr, &ptr, CBB_len(cbb.get())));
  ASSERT_TRUE(obj);
  ASSERT_TRUE(obj->simple);
  // Test the field was parsed correctly by reserializing it.
  TestSerialize(obj->simple, i2d, inp);
  EXPECT_FALSE(obj->opt);
  EXPECT_FALSE(obj->seq);
  TestSerialize(obj.get(), i2d_embed,
                {CBB_data(cbb.get()), CBB_len(cbb.get())});

  // Test all fields present.
  cbb.Reset();
  ASSERT_TRUE(CBB_init(cbb.get(), 64));
  CBB seq;
  ASSERT_TRUE(CBB_add_asn1(cbb.get(), &seq, CBS_ASN1_SEQUENCE));
  ASSERT_TRUE(CBB_add_bytes(&seq, inp.data(), inp.size()));
  CBB child;
  ASSERT_TRUE(CBB_add_asn1(
      &seq, &child, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_add_asn1(
      &seq, &child, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_flush(cbb.get()));
  ptr = CBB_data(cbb.get());
  obj.reset(d2i_embed(nullptr, &ptr, CBB_len(cbb.get())));
  ASSERT_TRUE(obj);
  ASSERT_TRUE(obj->simple);
  TestSerialize(obj->simple, i2d, inp);
  ASSERT_TRUE(obj->opt);
  TestSerialize(obj->opt, i2d, inp);
  ASSERT_EQ(sk_num(obj->seq), 2u);
  TestSerialize(sk_value(obj->seq, 0), i2d, inp);
  TestSerialize(sk_value(obj->seq, 1), i2d, inp);
  TestSerialize(obj.get(), i2d_embed,
                {CBB_data(cbb.get()), CBB_len(cbb.get())});
}